

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_bigint<std::allocator<unsigned_char>_>,_void>
::to_json(json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_bigint<std::allocator<unsigned_char>_>,_void>
          *this,basic_bigint<std::allocator<unsigned_char>_> *val)

{
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  basic_bigint<std::allocator<unsigned_char>>::
  write_string<char,std::char_traits<char>,std::allocator<char>>
            ((basic_bigint<std::allocator<unsigned_char>> *)val,&s);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,&s,bigint);
  std::__cxx11::string::~string((string *)&s);
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

static Json to_json(const basic_bigint<Allocator>& val)
        {
            std::basic_string<char_type> s;
            val.write_string(s);
            return Json(s,semantic_tag::bigint);
        }